

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Performance::anon_unknown_0::BaseCase::~BaseCase(BaseCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0214fe60;
  pcVar2 = (this->m_results).m_message._M_dataplus._M_p;
  paVar1 = &(this->m_results).m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_results).m_prefix._M_dataplus._M_p;
  paVar1 = &(this->m_results).m_prefix.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

virtual					~BaseCase			(void) {}